

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O3

SynBase * ParseTernaryExpr(ParseContext *ctx)

{
  LexemeType LVar1;
  Lexeme *begin;
  Lexeme *pLVar2;
  int iVar3;
  SynBase *pSVar4;
  SynBase *this;
  undefined4 extraout_var;
  SynBase *this_00;
  undefined4 extraout_var_00;
  SynBase *this_01;
  undefined4 extraout_var_01;
  
  pSVar4 = ParseArithmetic(ctx);
  if (pSVar4 == (SynBase *)0x0) {
    pSVar4 = (SynBase *)0x0;
  }
  else {
    begin = ctx->currentLexeme;
    LVar1 = begin->type;
    pLVar2 = begin;
    while (LVar1 == lex_questionmark) {
      ctx->currentLexeme = pLVar2 + 1;
      this = ParseAssignment(ctx);
      if (this == (SynBase *)0x0) {
        anon_unknown.dwarf_169315::Report
                  (ctx,ctx->currentLexeme,"ERROR: expression not found after \'?\'");
        iVar3 = (*ctx->allocator->_vptr_Allocator[2])();
        this = (SynBase *)CONCAT44(extraout_var,iVar3);
        if (ctx->currentLexeme <= ctx->firstLexeme) goto LAB_002160b5;
        SynBase::SynBase(this,0,begin,ctx->currentLexeme + -1);
        this->_vptr_SynBase = (_func_int **)&PTR__SynBase_003e6d30;
      }
      anon_unknown.dwarf_169315::CheckConsume
                (ctx,lex_colon,"ERROR: \':\' not found after expression in ternary operator");
      this_00 = ParseAssignment(ctx);
      if (this_00 == (SynBase *)0x0) {
        anon_unknown.dwarf_169315::Report
                  (ctx,ctx->currentLexeme,"ERROR: expression not found after \':\'");
        iVar3 = (*ctx->allocator->_vptr_Allocator[2])();
        this_00 = (SynBase *)CONCAT44(extraout_var_00,iVar3);
        if (ctx->currentLexeme <= ctx->firstLexeme) goto LAB_002160b5;
        SynBase::SynBase(this_00,0,begin,ctx->currentLexeme + -1);
        this_00->_vptr_SynBase = (_func_int **)&PTR__SynBase_003e6d30;
      }
      iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x58);
      this_01 = (SynBase *)CONCAT44(extraout_var_01,iVar3);
      if (ctx->currentLexeme <= ctx->firstLexeme) {
LAB_002160b5:
        __assert_fail("currentLexeme > firstLexeme",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ParseTree.cpp"
                      ,0x19c,"Lexeme *ParseContext::Previous()");
      }
      SynBase::SynBase(this_01,0x21,begin,ctx->currentLexeme + -1);
      this_01->_vptr_SynBase = (_func_int **)&PTR__SynBase_003e7b20;
      this_01[1]._vptr_SynBase = (_func_int **)pSVar4;
      *(SynBase **)&this_01[1].typeID = this;
      this_01[1].begin = (Lexeme *)this_00;
      pLVar2 = ctx->currentLexeme;
      pSVar4 = this_01;
      LVar1 = pLVar2->type;
    }
  }
  return pSVar4;
}

Assistant:

SynBase* ParseTernaryExpr(ParseContext &ctx)
{
	if(SynBase *value = ParseArithmetic(ctx))
	{
		Lexeme *pos = ctx.currentLexeme;

		while(ctx.Consume(lex_questionmark))
		{
			SynBase *trueBlock = ParseAssignment(ctx);

			if(!trueBlock)
			{
				Report(ctx, ctx.Current(), "ERROR: expression not found after '?'");

				trueBlock = new (ctx.get<SynError>()) SynError(pos, ctx.Previous());
			}

			CheckConsume(ctx, lex_colon, "ERROR: ':' not found after expression in ternary operator");

			SynBase *falseBlock = ParseAssignment(ctx);

			if(!falseBlock)
			{
				Report(ctx, ctx.Current(), "ERROR: expression not found after ':'");

				falseBlock = new (ctx.get<SynError>()) SynError(pos, ctx.Previous());
			}

			value = new (ctx.get<SynConditional>()) SynConditional(pos, ctx.Previous(), value, trueBlock, falseBlock);
		}

		return value;
	}

	return NULL;
}